

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O3

void __thiscall fasttext::Meter::writeGeneralMetrics(Meter *this,ostream *out,int32_t k)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  undefined1 auVar3 [16];
  undefined1 in_XMM2 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"N",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 3;
  std::__ostream_insert<char,std::char_traits<char>>(out,"P@",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,k);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
  auVar1._0_8_ = (this->metrics_).predicted;
  auVar1._8_8_ = (this->metrics_).predictedGold;
  auVar3 = vcvtuqq2pd_avx512vl(auVar1);
  auVar1 = vshufpd_avx(auVar3,auVar3,1);
  poVar2 = std::ostream::_M_insert<double>(auVar1._0_8_ / auVar3._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"R@",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,k);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
  auVar1 = vcvtusi2sd_avx512f(in_XMM2,(this->metrics_).predictedGold);
  auVar3 = vcvtusi2sd_avx512f(in_XMM2,(this->metrics_).gold);
  poVar2 = std::ostream::_M_insert<double>(auVar1._0_8_ / auVar3._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Meter::writeGeneralMetrics(std::ostream& out, int32_t k) const {
  out << "N"
      << "\t" << nexamples_ << std::endl;
  out << std::setprecision(3);
  out << "P@" << k << "\t" << metrics_.precision() << std::endl;
  out << "R@" << k << "\t" << metrics_.recall() << std::endl;
}